

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# condexe.cc
# Opt level: O2

bool __thiscall ConditionalExecution::trial(ConditionalExecution *this,BlockBasic *ib)

{
  bool bVar1;
  bool bVar2;
  int4 iVar3;
  BlockBasic *pBVar4;
  BlockBasic *pBVar5;
  BlockBasic *pBVar6;
  PcodeOp *pPVar7;
  BlockBasic *pBVar8;
  int4 iVar9;
  int4 iVar10;
  char cVar11;
  int iVar12;
  size_t in_RCX;
  uchar *sig;
  uchar *extraout_RDX;
  uchar *sig_00;
  uchar *extraout_RDX_00;
  uchar *in_R8;
  size_t in_R9;
  
  this->iblock = ib;
  buildHeritageArray(this);
  iVar12 = verify(this,(EVP_PKEY_CTX *)ib,sig,in_RCX,in_R8,in_R9);
  cVar11 = (char)iVar12;
  sig_00 = extraout_RDX;
  if (cVar11 != '\0') {
    do {
      if (this->directsplit != true) {
        return (bool)cVar11;
      }
      pPVar7 = this->cbranch;
      pBVar8 = this->initblock;
      pBVar4 = this->iblock;
      iVar3 = this->prea_inslot;
      bVar1 = this->init2a_true;
      bVar2 = this->iblock2posta_true;
      iVar9 = this->camethruposta_slot;
      iVar10 = this->posta_outslot;
      pBVar5 = this->posta_block;
      pBVar6 = this->postb_block;
      this->iblock = pBVar5;
      iVar12 = verify(this,(EVP_PKEY_CTX *)ib,sig_00,in_RCX,in_R8,in_R9);
      sig_00 = extraout_RDX_00;
    } while ((char)iVar12 != '\0');
    this->cbranch = pPVar7;
    this->initblock = pBVar8;
    this->iblock = pBVar4;
    this->prea_inslot = iVar3;
    this->init2a_true = bVar1;
    this->iblock2posta_true = bVar2;
    this->camethruposta_slot = iVar9;
    this->posta_outslot = iVar10;
    this->posta_block = pBVar5;
    this->postb_block = pBVar6;
    this->directsplit = true;
  }
  return (bool)cVar11;
}

Assistant:

bool ConditionalExecution::trial(BlockBasic *ib)

{
  iblock = ib;
  buildHeritageArray();
  if (!verify()) return false;

  PcodeOp *cbranch_copy;
  BlockBasic *initblock_copy;
  BlockBasic *iblock_copy;
  int4 prea_inslot_copy;
  bool init2a_true_copy;
  bool iblock2posta_true_copy;
  int4 camethruposta_slot_copy;
  int4 posta_outslot_copy;
  BlockBasic *posta_block_copy;
  BlockBasic *postb_block_copy;
  bool directsplit_copy;

  for(;;) {
    if (!directsplit) return true;
    // Save off the data for current iblock
    cbranch_copy = cbranch;
    initblock_copy = initblock;
    iblock_copy = iblock;
    prea_inslot_copy = prea_inslot;
    init2a_true_copy = init2a_true;
    iblock2posta_true_copy = iblock2posta_true;
    camethruposta_slot_copy = camethruposta_slot;
    posta_outslot_copy = posta_outslot;
    posta_block_copy = posta_block;
    postb_block_copy = postb_block;
    directsplit_copy = directsplit;

    iblock = posta_block;
    if (!verify()) {
      cbranch = cbranch_copy;
      initblock = initblock_copy;
      iblock = iblock_copy;
      prea_inslot = prea_inslot_copy;
      init2a_true = init2a_true_copy;
      iblock2posta_true = iblock2posta_true_copy;
      camethruposta_slot = camethruposta_slot_copy;
      posta_outslot = posta_outslot_copy;
      posta_block = posta_block_copy;
      postb_block = postb_block_copy;
      directsplit = directsplit_copy;
      return true;
    }
  }
}